

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Performance::getNameSpecialization_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,deUint32 id)

{
  string local_30;
  
  toStringWithPadding<unsigned_int>(&local_30,(uint)this,10);
  std::operator+(__return_storage_ptr__,"_",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static string getNameSpecialization (deUint32 id)
{
	return "_" + toStringWithPadding(id, 10);
}